

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O0

int luaB_dofile(lua_State *L)

{
  int iVar1;
  char *filename;
  char *fname;
  lua_State *L_local;
  
  filename = luaL_optlstring(L,1,(char *)0x0,(size_t *)0x0);
  lua_settop(L,1);
  iVar1 = luaL_loadfilex(L,filename,(char *)0x0);
  if (iVar1 == 0) {
    lua_callk(L,0,-1,0,dofilecont);
    L_local._4_4_ = dofilecont(L,0,0);
  }
  else {
    L_local._4_4_ = lua_error(L);
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_dofile (lua_State *L) {
  const char *fname = luaL_optstring(L, 1, NULL);
  lua_settop(L, 1);
  if (l_unlikely(luaL_loadfile(L, fname) != LUA_OK))
    return lua_error(L);
  lua_callk(L, 0, LUA_MULTRET, 0, dofilecont);
  return dofilecont(L, 0, 0);
}